

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O1

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  connectdata *pcVar2;
  curl_socket_t cVar3;
  curl_sslbackend cVar4;
  long lVar5;
  curl_slist *pcVar6;
  double dVar7;
  void *pvVar8;
  byte bVar9;
  char *pcVar10;
  char *pcVar11;
  CURLcode CVar12;
  ssl_connect_data *psVar13;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  CVar12 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info != CURLINFO_EFFECTIVE_URL) {
        if (info == CURLINFO_CONTENT_TYPE) {
          pcVar10 = (data->info).contenttype;
        }
        else {
          if (info != CURLINFO_PRIVATE) {
            return CURLE_UNKNOWN_OPTION;
          }
          pcVar10 = (char *)(data->set).private_data;
        }
        goto LAB_005a0924;
      }
      pcVar10 = (data->state).url;
      pcVar11 = "";
      if (pcVar10 != (char *)0x0) {
        pcVar11 = pcVar10;
      }
      *local_c8 = (double)pcVar11;
      goto LAB_005a0927;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar10 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar10 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar10 = (data->info).conn_primary_ip;
      goto LAB_005a0860;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_005a017f_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar10 = (data->set).str[0x30];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar10 = (data->info).conn_local_ip;
LAB_005a0860:
      *local_c8 = (double)pcVar10;
      goto LAB_005a0927;
    default:
      switch(info) {
      case CURLINFO_EFFECTIVE_METHOD:
        pcVar10 = (data->set).str[6];
        if (pcVar10 == (char *)0x0) {
          if (((data->set).field_0x8e5 & 2) == 0) {
            bVar9 = (data->state).httpreq - 1;
            if (bVar9 < 5) {
              pcVar10 = &DAT_007b301c + *(int *)(&DAT_007b301c + (ulong)bVar9 * 4);
            }
            else {
              pcVar10 = "GET";
            }
          }
          else {
            pcVar10 = "HEAD";
          }
        }
        break;
      case 0x10003b:
        goto switchD_005a017f_default;
      case CURLINFO_REFERER:
        pcVar10 = (data->state).referer;
        break;
      case CURLINFO_CAINFO:
      case CURLINFO_CAPATH:
        *local_c8 = 0.0;
        goto LAB_005a0927;
      default:
        if (info != CURLINFO_SCHEME) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar10 = (data->info).conn_scheme;
      }
    }
LAB_005a0924:
    *local_c8 = (double)pcVar10;
    goto LAB_005a0927;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_HEADER_SIZE:
      dVar7 = (double)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      dVar7 = (double)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      dVar7 = (double)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      dVar7 = (double)(data->info).filetime;
      break;
    case 0x20000f:
    case 0x200010:
    case 0x200011:
    case 0x200012:
    case 0x200013:
    case 0x200015:
    case 0x20001b:
    case 0x20001c:
    case 0x20001e:
    case 0x20001f:
    case 0x200020:
    case 0x200021:
    case 0x200022:
    case 0x200024:
    case CURLINFO_RTSP_CLIENT_CSEQ:
    case CURLINFO_RTSP_SERVER_CSEQ:
    case CURLINFO_RTSP_CSEQ_RECV:
    case 0x200029:
    case 0x20002b:
    case 0x20002c:
    case 0x20002d:
      goto switchD_005a017f_default;
    case CURLINFO_REDIRECT_COUNT:
      dVar7 = (double)(data->state).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      dVar7 = (double)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      dVar7 = (double)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      dVar7 = (double)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      dVar7 = (double)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      dVar7 = (double)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar3 = Curl_getconnectinfo(data,(connectdata **)0x0);
      if (cVar3 != -1) {
        *local_c8 = (double)(long)cVar3;
        return CURLE_OK;
      }
      *local_c8 = -NAN;
      return CURLE_OK;
    case CURLINFO_CONDITION_UNMET:
      if ((data->info).httpcode != 0x130) {
        dVar7 = (double)(ulong)((byte)(data->info).field_0xec & 1);
        break;
      }
LAB_005a08d8:
      *local_c8 = 4.94065645841247e-324;
      goto LAB_005a0927;
    case CURLINFO_PRIMARY_PORT:
      dVar7 = (double)(long)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      dVar7 = (double)(long)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 < 0x14) {
        if (iVar1 == 10) goto LAB_005a08d8;
        if (iVar1 == 0xb) {
          *local_c8 = 9.88131291682493e-324;
        }
        else {
LAB_005a0900:
          *local_c8 = 0.0;
        }
      }
      else if (iVar1 == 0x14) {
        *local_c8 = 1.48219693752374e-323;
      }
      else {
        if (iVar1 != 0x1e) goto LAB_005a0900;
        *local_c8 = 1.48219693752374e-322;
      }
      goto LAB_005a0927;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      dVar7 = (double)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      dVar7 = (double)(ulong)(data->info).conn_protocol;
      break;
    default:
      if (info == CURLINFO_PROXY_ERROR) {
        dVar7 = (double)(ulong)(data->info).pxcode;
      }
      else {
        if (info != CURLINFO_RESPONSE_CODE) {
          return CURLE_UNKNOWN_OPTION;
        }
        dVar7 = (double)(long)(data->info).httpcode;
      }
    }
    *local_c8 = dVar7;
    goto LAB_005a0927;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar6 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar6 = Curl_cookie_list(data);
      }
      *local_c8 = (double)pcVar6;
    }
    else {
      if (info != CURLINFO_CERTINFO) {
        if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar2 = data->conn;
        *local_c8 = (double)&data->tsi;
        cVar4 = Curl_ssl_backend();
        (data->tsi).backend = cVar4;
        (data->tsi).internals = (void *)0x0;
        if (cVar4 == CURLSSLBACKEND_NONE || pcVar2 == (connectdata *)0x0) {
          return CURLE_OK;
        }
        psVar13 = pcVar2->ssl;
        lVar5 = 1;
        do {
          if ((psVar13->field_0x10 & 1) != 0) {
            pvVar8 = (*Curl_ssl->get_internals)(psVar13,info);
            (data->tsi).internals = pvVar8;
            return CURLE_OK;
          }
          psVar13 = psVar13 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 == 0);
        return CURLE_OK;
      }
      *local_c8 = (double)&(data->info).certs;
    }
    goto LAB_005a0927;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar3 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar3;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME_T:
      pcVar10 = (char *)(data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME_T:
      pcVar10 = (char *)(data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME_T:
      pcVar10 = (char *)(data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME_T:
      pcVar10 = (char *)(data->progress).t_pretransfer;
      break;
    case CURLINFO_STARTTRANSFER_TIME_T:
      pcVar10 = (char *)(data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME_T:
      pcVar10 = (char *)(data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME_T:
      pcVar10 = (char *)(data->progress).t_appconnect;
      break;
    case CURLINFO_RETRY_AFTER:
      pcVar10 = (char *)(data->info).retry_after;
      break;
    default:
      switch(info) {
      case CURLINFO_SIZE_UPLOAD_T:
        pcVar10 = (char *)(data->progress).uploaded;
        break;
      case CURLINFO_SIZE_DOWNLOAD_T:
        pcVar10 = (char *)(data->progress).downloaded;
        break;
      case CURLINFO_SPEED_DOWNLOAD_T:
        pcVar10 = (char *)(data->progress).dlspeed;
        break;
      case CURLINFO_SPEED_UPLOAD_T:
        pcVar10 = (char *)(data->progress).ulspeed;
        break;
      default:
        goto switchD_005a017f_default;
      case CURLINFO_FILETIME_T:
        pcVar10 = (char *)(data->info).filetime;
        break;
      case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
        pcVar10 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x40) != 0) {
          pcVar10 = (char *)(data->progress).size_dl;
        }
        break;
      case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
        pcVar10 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x20) != 0) {
          pcVar10 = (char *)(data->progress).size_ul;
        }
      }
    }
    goto LAB_005a0924;
  default:
    goto switchD_005a017f_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar7 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar7 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar7 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar7 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar7 = (double)(data->progress).uploaded;
    goto LAB_005a060c;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar7 = (double)(data->progress).downloaded;
    goto LAB_005a060c;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar7 = (double)(data->progress).dlspeed;
    goto LAB_005a060c;
  case CURLINFO_SPEED_UPLOAD:
    dVar7 = (double)(data->progress).ulspeed;
    goto LAB_005a060c;
  default:
    goto switchD_005a017f_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_005a0657:
      dVar7 = -1.0;
    }
    else {
      dVar7 = (double)(data->progress).size_dl;
    }
    goto LAB_005a060c;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_005a0657;
    dVar7 = (double)(data->progress).size_ul;
    goto LAB_005a060c;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar7 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar7 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar7 = (double)(data->progress).t_appconnect;
  }
  dVar7 = dVar7 / 1000000.0;
LAB_005a060c:
  *local_c8 = dVar7;
LAB_005a0927:
  CVar12 = CURLE_OK;
switchD_005a017f_default:
  return CVar12;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}